

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O2

bool __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::parse<unsigned_long,cmake*>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *this,string *input,
          unsigned_long *index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *allArgs,cmake **state)

{
  unsigned_long uVar1;
  pointer pbVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ParseMode parseState;
  string value;
  ParseMode local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  ulong *local_60;
  cmake **local_58;
  string local_50;
  
  local_8c = 0;
  switch(*(int *)(this + 0x60)) {
  case 0:
    if (input->_M_string_length == *(size_type *)(this + 0x48)) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      bVar3 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                            *)(this + 0x68),&local_88,*state);
      goto LAB_0030b905;
    }
    local_8c = 2;
    goto LAB_0030b926;
  case 1:
  case 3:
    if (input->_M_string_length == *(size_type *)(this + 0x48)) {
      uVar4 = *index + 1;
      pbVar2 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((uVar4 < (ulong)((long)(allArgs->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5))
         && (*pbVar2[uVar4]._M_dataplus._M_p != '-')) {
        bVar3 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                              *)(this + 0x68),pbVar2 + uVar4,*state);
        local_8c = (ParseMode)!bVar3;
        *index = uVar4;
        break;
      }
      if (*(int *)(this + 0x60) != 3) goto LAB_0030b7ec;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      bVar3 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                            *)(this + 0x68),&local_88,*state);
LAB_0030b905:
      local_8c = (ParseMode)(bVar3 ^ 1);
    }
    else {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                (&local_88,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,input,&local_8c);
      if (local_8c == 0) {
        bVar3 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                              *)(this + 0x68),&local_88,*state);
        goto LAB_0030b905;
      }
    }
LAB_0030b90e:
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case 2:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) break;
    uVar1 = *index;
    uVar4 = uVar1 + 2;
    pbVar2 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((uVar4 < (ulong)((long)(allArgs->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) &&
        (*pbVar2[uVar1 + 1]._M_dataplus._M_p != '-')) && (*pbVar2[uVar4]._M_dataplus._M_p != '-')) {
      *index = uVar4;
      cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
                (&local_88,pbVar2 + uVar1 + 1,(char (*) [2])0x712d8b,pbVar2 + uVar4);
      bVar3 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                            *)(this + 0x68),&local_88,*state);
      goto LAB_0030b905;
    }
LAB_0030b7ec:
    local_8c = 3;
    goto LAB_0030b957;
  case 4:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                (&local_88,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,input,&local_8c);
      if (local_8c != 0) goto LAB_0030b90e;
      bVar3 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                            *)(this + 0x68),&local_88,*state);
      goto LAB_0030b905;
    }
    uVar1 = *index;
    uVar4 = uVar1 + 1;
    pbVar2 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_60 = index;
    local_58 = state;
    if (((ulong)((long)(allArgs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar4) ||
       (*pbVar2[uVar4]._M_dataplus._M_p == '-')) goto LAB_0030b7ec;
    local_68 = input;
    std::__cxx11::string::string((string *)&local_88,(string *)(pbVar2 + uVar4));
    lVar5 = uVar1 * 0x20 + 0x40;
    while( true ) {
      pbVar2 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(allArgs->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
           uVar4 + 1) || (**(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar5) == '-')) break;
      cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&>
                (&local_50,&local_88,(char (*) [2])0x712d8b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pbVar2->_M_dataplus)._M_p + lVar5));
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lVar5 = lVar5 + 0x20;
      uVar4 = uVar4 + 1;
    }
    bVar3 = std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
            ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                          *)(this + 0x68),&local_88,*local_58);
    local_8c = (ParseMode)!bVar3;
    *local_60 = uVar4;
    std::__cxx11::string::~string((string *)&local_88);
    input = local_68;
    break;
  default:
    goto switchD_0030b631_default;
  }
  if (local_8c == 3) {
LAB_0030b957:
    cmSystemTools::Error((string *)(this + 0x20));
  }
  else if (local_8c == 2) {
LAB_0030b926:
    cmStrCat<char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
              (&local_88,(char (*) [2])0x7731ae,input,(char (*) [2])0x7731ae,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    cmSystemTools::Error(&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
switchD_0030b631_default:
  return local_8c == 0;
}

Assistant:

bool parse(std::string const& input, T& index,
             std::vector<std::string> const& allArgs,
             CallState&&... state) const
  {
    ParseMode parseState = ParseMode::Valid;

    if (this->Type == Values::Zero) {
      if (input.size() == this->Name.size()) {
        parseState =
          this->StoreCall(std::string{}, std::forward<CallState>(state)...)
          ? ParseMode::Valid
          : ParseMode::Invalid;
      } else {
        parseState = ParseMode::SyntaxError;
      }

    } else if (this->Type == Values::One || this->Type == Values::ZeroOrOne) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          if (this->Type == Values::ZeroOrOne) {
            parseState =
              this->StoreCall(std::string{}, std::forward<CallState>(state)...)
              ? ParseMode::Valid
              : ParseMode::Invalid;
          } else {
            parseState = ParseMode::ValueError;
          }
        } else {
          parseState = this->StoreCall(allArgs[nextValueIndex],
                                       std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = nextValueIndex;
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::Two) {
      if (input.size() == this->Name.size()) {
        if (index + 2 >= allArgs.size() || allArgs[index + 1][0] == '-' ||
            allArgs[index + 2][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          index += 2;
          parseState =
            this->StoreCall(cmStrCat(allArgs[index - 1], ";", allArgs[index]),
                            std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::OneOrMore) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          std::string buffer = allArgs[nextValueIndex++];
          while (nextValueIndex < allArgs.size() &&
                 allArgs[nextValueIndex][0] != '-') {
            buffer = cmStrCat(buffer, ";", allArgs[nextValueIndex++]);
          }
          parseState =
            this->StoreCall(buffer, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = (nextValueIndex - 1);
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    }

    if (parseState == ParseMode::SyntaxError) {
      cmSystemTools::Error(
        cmStrCat("'", input, "'", this->InvalidSyntaxMessage));
    } else if (parseState == ParseMode::ValueError) {
      cmSystemTools::Error(this->InvalidValueMessage);
    }
    return (parseState == ParseMode::Valid);
  }